

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::ParseFromArray
          (JavaHprofConfig_ContinuousDumpConfig *this,void *raw,size_t size)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t *end;
  uint uVar8;
  ulong uVar9;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_58;
  ushort local_54;
  uint8_t local_52;
  JavaHprofConfig_ContinuousDumpConfig *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  bitset<4UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar7 = 0;
  local_50 = this;
  do {
    if (end <= raw) goto switchD_002bd7bc_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar4 != (uint64_t *)raw) goto LAB_002bd784;
LAB_002bdae2:
      uVar7 = 0;
      uVar5 = 0;
      goto LAB_002bd8b6;
    }
    puVar4 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002bd784:
    uVar1 = preamble;
    uVar9 = preamble >> 3;
    uVar8 = (uint)uVar9;
    if ((uVar8 == 0) || (end <= puVar4)) goto LAB_002bdae2;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar4,(uint8_t *)end,&int_value);
      uVar6 = 0;
      uVar5 = 0;
      if (puVar3 == puVar4) goto LAB_002bd8b6;
      break;
    case 1:
      puVar3 = puVar4 + 1;
      if (end < puVar3) goto switchD_002bd7bc_caseD_3;
      int_value = *puVar4;
LAB_002bd808:
      uVar6 = 0;
      break;
    case 2:
      puVar2 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar4,(uint8_t *)end,&payload_length)
      ;
      if ((puVar2 == puVar4) || ((ulong)((long)end - (long)puVar2) < payload_length))
      goto switchD_002bd7bc_caseD_3;
      puVar3 = (uint64_t *)((long)puVar2 + payload_length);
      uVar6 = payload_length;
      int_value = (uint64_t)puVar2;
      break;
    default:
      goto switchD_002bd7bc_caseD_3;
    case 5:
      puVar3 = (uint64_t *)((long)puVar4 + 4);
      if (puVar3 <= end) {
        int_value = (uint64_t)(uint)*puVar4;
        goto LAB_002bd808;
      }
      goto switchD_002bd7bc_caseD_3;
    }
    raw = puVar3;
  } while ((0xffff < uVar8) || (0xfffffff < uVar6));
  uVar7 = uVar6 | (uVar1 & 7) << 0x30 | uVar9 << 0x20;
  uVar5 = int_value;
LAB_002bd8b6:
  local_40 = &local_50->_has_field_;
LAB_002bd8cc:
  do {
    preamble = uVar5;
    local_58 = (uint32_t)uVar7;
    local_52 = (uint8_t)(uVar7 >> 0x30);
    uVar8 = (uint)(uVar7 >> 0x20);
    local_54 = (ushort)(uVar7 >> 0x20);
    if (local_54 == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_54 < 4) {
      ::std::bitset<4UL>::set((bitset<4UL> *)local_40,(ulong)(uVar8 & 3),true);
      uVar8 = (uint)local_54;
    }
    if ((short)uVar8 == 3) {
      local_50->scan_pids_only_on_start_ = preamble != 0;
    }
    else if ((uVar8 & 0xffff) == 2) {
      local_50->dump_interval_ms_ = (uint32_t)preamble;
    }
    else if ((uVar8 & 0xffff) == 1) {
      local_50->dump_phase_ms_ = (uint32_t)preamble;
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_48);
    }
    do {
      if (end <= raw) {
LAB_002bdabf:
        uVar7 = 0;
        uVar5 = 0;
        goto LAB_002bd8cc;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar4 == (uint64_t *)raw) goto LAB_002bdabf;
      }
      else {
        puVar4 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar1 = int_value;
      uVar9 = int_value >> 3;
      uVar8 = (uint)uVar9;
      if ((uVar8 == 0) || (end <= puVar4)) goto LAB_002bdabf;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar4,(uint8_t *)end,&payload_length);
        uVar6 = 0;
        uVar7 = 0;
        uVar5 = 0;
        if (puVar3 == puVar4) goto LAB_002bd8cc;
        break;
      case 1:
        puVar3 = puVar4 + 1;
        if (end < puVar3) goto switchD_002bd9c8_caseD_3;
        payload_length = *puVar4;
LAB_002bda1f:
        uVar6 = 0;
        break;
      case 2:
        puVar2 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar4,(uint8_t *)end,&payload_length_1);
        if ((puVar2 == puVar4) || ((ulong)((long)end - (long)puVar2) < payload_length_1))
        goto switchD_002bd9c8_caseD_3;
        puVar3 = (uint64_t *)((long)puVar2 + payload_length_1);
        uVar6 = payload_length_1;
        payload_length = (uint64_t)puVar2;
        break;
      default:
        goto switchD_002bd9c8_caseD_3;
      case 5:
        puVar3 = (uint64_t *)((long)puVar4 + 4);
        if (puVar3 <= end) {
          payload_length = (uint64_t)(uint)*puVar4;
          goto LAB_002bda1f;
        }
        goto switchD_002bd9c8_caseD_3;
      }
      raw = puVar3;
    } while ((0xffff < uVar8) || (0xfffffff < uVar6));
    uVar7 = uVar6 | (uVar1 & 7) << 0x30 | uVar9 << 0x20;
    uVar5 = payload_length;
  } while( true );
switchD_002bd7bc_caseD_3:
  uVar7 = 0;
  uVar5 = 0;
  goto LAB_002bd8b6;
switchD_002bd9c8_caseD_3:
  uVar7 = 0;
  uVar5 = 0;
  goto LAB_002bd8cc;
}

Assistant:

bool JavaHprofConfig_ContinuousDumpConfig::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* dump_phase_ms */:
        field.get(&dump_phase_ms_);
        break;
      case 2 /* dump_interval_ms */:
        field.get(&dump_interval_ms_);
        break;
      case 3 /* scan_pids_only_on_start */:
        field.get(&scan_pids_only_on_start_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}